

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

bool __thiscall rtosc::Port_Matcher::rtosc_match_args(Port_Matcher *this,char *pattern,char *msg)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  
  do {
    if (*pattern != ':') {
      return true;
    }
    pattern = pattern + 1;
    pcVar3 = rtosc_argument_string(msg);
    bVar4 = true;
    if (*pattern == '\0') {
      bVar4 = *pcVar3 == '\0';
    }
    while( true ) {
      cVar1 = *pattern;
      if (cVar1 == '\0') {
        return bVar4;
      }
      if (cVar1 == ':') break;
      pattern = pattern + 1;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      bVar4 = (bool)(bVar4 & cVar1 == cVar2);
    }
  } while ((bVar4 == false) || (*pcVar3 != '\0'));
  return true;
}

Assistant:

bool rtosc_match_args(const char *pattern, const char *msg)
        {
            //match anything if no arg restriction is present
            //(ie the ':')
            if(*pattern++ != ':')
                return true;

            const char *arg_str = rtosc_argument_string(msg);
            bool      arg_match = *pattern || *pattern == *arg_str;

            while(*pattern && *pattern != ':')
                arg_match &= (*pattern++==*arg_str++);

            if(*pattern==':') {
                if(arg_match && !*arg_str)
                    return true;
                else
                    return rtosc_match_args(pattern, msg); //retry
            }

            return arg_match;
        }